

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

uint rbuDeltaGetInt(char **pz,int *pLen)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  
  pcVar1 = *pz;
  lVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (rbuDeltaGetInt::zValue[(byte)pcVar1[lVar3] & 0x7f] < '\0') break;
    uVar2 = uVar2 * 0x40 + (int)rbuDeltaGetInt::zValue[(byte)pcVar1[lVar3] & 0x7f];
    lVar3 = lVar3 + 1;
  }
  *pLen = *pLen - (int)lVar3;
  *pz = pcVar1 + lVar3;
  return uVar2;
}

Assistant:

static unsigned int rbuDeltaGetInt(const char **pz, int *pLen){
  static const signed char zValue[] = {
    -1, -1, -1, -1, -1, -1, -1, -1,   -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1,   -1, -1, -1, -1, -1, -1, -1, -1,
    -1, -1, -1, -1, -1, -1, -1, -1,   -1, -1, -1, -1, -1, -1, -1, -1,
     0,  1,  2,  3,  4,  5,  6,  7,    8,  9, -1, -1, -1, -1, -1, -1,
    -1, 10, 11, 12, 13, 14, 15, 16,   17, 18, 19, 20, 21, 22, 23, 24,
    25, 26, 27, 28, 29, 30, 31, 32,   33, 34, 35, -1, -1, -1, -1, 36,
    -1, 37, 38, 39, 40, 41, 42, 43,   44, 45, 46, 47, 48, 49, 50, 51,
    52, 53, 54, 55, 56, 57, 58, 59,   60, 61, 62, -1, -1, -1, 63, -1,
  };
  unsigned int v = 0;
  int c;
  unsigned char *z = (unsigned char*)*pz;
  unsigned char *zStart = z;
  while( (c = zValue[0x7f&*(z++)])>=0 ){
     v = (v<<6) + c;
  }
  z--;
  *pLen -= z - zStart;
  *pz = (char*)z;
  return v;
}